

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxMemory.cpp
# Opt level: O3

void * Jinx::MemAllocate(size_t bytes)

{
  void *pvVar1;
  size_t local_8;
  
  LOCK();
  Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
  UNLOCK();
  LOCK();
  Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + bytes);
  UNLOCK();
  local_8 = bytes;
  if (Mem::allocFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    pvVar1 = (*Mem::allocFn._M_invoker)((_Any_data *)&Mem::allocFn,&local_8);
    return pvVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline_t void * MemAllocate(size_t bytes)
	{
		Mem::allocationCount++;
		Mem::allocatedMemory += bytes;
		return reinterpret_cast<uint8_t *>(Mem::allocFn(bytes));
	}